

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O2

double AlphaVectorPruning::GetBeliefDiff
                 (vector<double,_std::allocator<double>_> *belief0,
                 vector<double,_std::allocator<double>_> *belief1)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  uint uVar4;
  reference pvVar5;
  ulong __n;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  
  pdVar2 = (belief0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  dVar7 = 0.0;
  uVar4 = 0;
  pdVar3 = (belief0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    __n = (ulong)uVar4;
    if ((ulong)((long)pdVar2 - (long)pdVar3 >> 3) <= __n) break;
    pvVar5 = std::vector<double,_std::allocator<double>_>::at(belief0,__n);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::at(belief1,__n);
    uVar4 = uVar4 + 1;
    auVar6._8_8_ = 0x7fffffffffffffff;
    auVar6._0_8_ = 0x7fffffffffffffff;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar1 - *pvVar5;
    auVar6 = vandpd_avx512vl(auVar8,auVar6);
    dVar7 = dVar7 + auVar6._0_8_;
  }
  return dVar7;
}

Assistant:

double AlphaVectorPruning::GetBeliefDiff(vector<double> &belief0, vector<double> &belief1)
{
    size_t nrStates = belief0.size();
    double totalDiff = 0.0;

    for(Index j=0; j<nrStates; j++)
    {
        totalDiff = totalDiff + std::abs(belief0.at(j)-belief1.at(j));
    }

    return totalDiff;
}